

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moves_sort.cpp
# Opt level: O0

void InitRootMove(Situation *situation,int *num_of_all_movements,Movement *all_movements)

{
  int iVar1;
  bool bVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  long in_RDX;
  Movement *in_RSI;
  Movement *in_RDI;
  int j;
  Situation *unaff_retaddr;
  int i;
  int numofnocap;
  Situation *in_stack_00000028;
  Situation *in_stack_00000030;
  Movement *in_stack_00000040;
  int *in_stack_00000048;
  Situation *in_stack_00000050;
  int local_24;
  int local_20;
  
  GetAllCaptureMovements(in_stack_00000050,in_stack_00000048,in_stack_00000040);
  CaptureValue(unaff_retaddr,(int *)in_RDI,in_RSI);
  std::sort<Movement*,bool(*)(Movement&,Movement&)>
            ((Movement *)unaff_retaddr,in_RDI,(_func_bool_Movement_ptr_Movement_ptr *)in_RSI);
  local_20._0_1_ = in_RSI->from;
  local_20._1_1_ = in_RSI->to;
  local_20._2_1_ = in_RSI->capture;
  local_20._3_1_ = in_RSI->field_0x3;
  GetAllNotCaptureMovements
            (in_stack_00000030,&in_stack_00000028->current_player,(Movement *)situation);
  for (; iVar1._0_1_ = in_RSI->from, iVar1._1_1_ = in_RSI->to, iVar1._2_1_ = in_RSI->capture,
      iVar1._3_1_ = in_RSI->field_0x3, local_20 < iVar1; local_20 = local_20 + 1) {
    bVar2 = MakeAMove(in_stack_00000028,(Movement *)situation,num_of_all_movements._7_1_);
    if (bVar2) {
      for (local_24 = local_20; local_24 < *(int *)in_RSI + -1; local_24 = local_24 + 1) {
        puVar4 = (undefined8 *)(in_RDX + (long)(local_24 + 1) * 0xc);
        puVar3 = (undefined8 *)(in_RDX + (long)local_24 * 0xc);
        *puVar3 = *puVar4;
        *(undefined4 *)(puVar3 + 1) = *(undefined4 *)(puVar4 + 1);
      }
      *(int *)in_RSI = *(int *)in_RSI + -1;
      local_20 = local_20 + -1;
    }
    UnMakeAMove(in_stack_00000030);
  }
  std::vector<Movement,_std::allocator<Movement>_>::clear
            ((vector<Movement,_std::allocator<Movement>_> *)0x10bb89);
  return;
}

Assistant:

void InitRootMove(Situation& situation, int& num_of_all_movements, Movement* all_movements){
    // 吃子着法
    GetAllCaptureMovements(situation, num_of_all_movements, all_movements);
    CaptureValue(situation, num_of_all_movements, all_movements);
    std::sort(all_movements, all_movements + num_of_all_movements, cmp);
    int numofnocap = num_of_all_movements;
    // 不吃子着法
    GetAllNotCaptureMovements(situation, num_of_all_movements, all_movements);
    for(int i = numofnocap; i < num_of_all_movements; i ++){
        if(MakeAMove(situation, all_movements[i], 1)){
            // std::cout << "remove " << int(all_movements[i].from) << " " << int(all_movements[i].to) << " \n";
            for(int j = i; j < num_of_all_movements - 1; j ++){
                all_movements[j] = all_movements[j + 1];
            }
            num_of_all_movements --;
            i--;
        }
        UnMakeAMove(situation);
    }
    situation.moves_stack.clear();
}